

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O0

void __thiscall
cfd::js::api::json::PsbtOutputRequest::PsbtOutputRequest
          (PsbtOutputRequest *this,PsbtOutputRequest *param_1)

{
  PsbtOutputRequest *param_1_local;
  PsbtOutputRequest *this_local;
  
  core::JsonClassBase<cfd::js::api::json::PsbtOutputRequest>::JsonClassBase
            (&this->super_JsonClassBase<cfd::js::api::json::PsbtOutputRequest>,
             &param_1->super_JsonClassBase<cfd::js::api::json::PsbtOutputRequest>);
  (this->super_JsonClassBase<cfd::js::api::json::PsbtOutputRequest>)._vptr_JsonClassBase =
       (_func_int **)&PTR__PsbtOutputRequest_01b49e18;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->ignore_items,&param_1->ignore_items);
  this->index_ = param_1->index_;
  PsbtOutputRequestData::PsbtOutputRequestData(&this->output_,&param_1->output_);
  return;
}

Assistant:

PsbtOutputRequest() {
    CollectFieldName();
  }